

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void * __thiscall
vector<vector<int>_>::realloc(vector<vector<int>_> *this,void *__ptr,size_t __size)

{
  vector<int> *pvVar1;
  void *pvVar2;
  ulong *puVar3;
  undefined4 *puVar4;
  void *extraout_RAX;
  long lVar5;
  long lVar6;
  
  pvVar2 = (void *)0x1;
  if (1 < (int)__ptr) {
    pvVar2 = (void *)((ulong)__ptr & 0xffffffff);
  }
  if (this->_capacity != (int)pvVar2) {
    puVar3 = (ulong *)operator_new__((long)pvVar2 * 0x10 + 8);
    *puVar3 = (ulong)pvVar2;
    lVar5 = 0;
    do {
      puVar4 = (undefined4 *)operator_new__(4);
      *puVar4 = 0;
      *(undefined4 **)((long)puVar3 + lVar5 + 8) = puVar4;
      *(undefined8 *)((long)puVar3 + lVar5 + 0x10) = 0x100000000;
      lVar5 = lVar5 + 0x10;
    } while ((long)pvVar2 * 0x10 != lVar5);
    if (0 < this->_size) {
      lVar6 = 0;
      lVar5 = 0;
      do {
        vector<int>::operator=
                  ((vector<int> *)((long)&((vector<int> *)(puVar3 + 1))->vect + lVar6),
                   (vector<int> *)((long)&this->vect->vect + lVar6));
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < this->_size);
    }
    this->_capacity = (int)pvVar2;
    pvVar1 = this->vect;
    if (pvVar1 != (vector<int> *)0x0) {
      lVar5._0_4_ = pvVar1[-1]._size;
      lVar5._4_4_ = pvVar1[-1]._capacity;
      if (lVar5 != 0) {
        lVar5 = lVar5 << 4;
        do {
          pvVar2 = *(void **)((long)&pvVar1[-1].vect + lVar5);
          if (pvVar2 != (void *)0x0) {
            operator_delete__(pvVar2);
          }
          lVar5 = lVar5 + -0x10;
        } while (lVar5 != 0);
      }
      operator_delete__(&pvVar1[-1]._size);
      pvVar2 = extraout_RAX;
    }
    this->vect = (vector<int> *)(puVar3 + 1);
  }
  return pvVar2;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}